

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Expression * __thiscall
soul::StructuralParser::parseDotOperator(StructuralParser *this,Expression *expression)

{
  Op op;
  UnqualifiedName *args_2;
  PoolItem *pPVar1;
  Expression *pEVar2;
  DotOperator *expression_00;
  Context context;
  Identifier name;
  
  name.name = (string *)(this->super_SOULTokeniser).location.sourceCode.object;
  if ((SourceCodeText *)name.name != (SourceCodeText *)0x0) {
    (((SourceCodeText *)name.name)->super_RefCountedObject).refCount =
         (((SourceCodeText *)name.name)->super_RefCountedObject).refCount + 1;
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x288ec7);
  args_2 = parseUnqualifiedName(this);
  op = AST::TypeMetaFunction::getOperationForName(name);
  if (op == none) {
    expression_00 =
         PoolAllocator::
         allocate<soul::AST::DotOperator,soul::AST::Context&,soul::AST::Expression&,soul::AST::UnqualifiedName&>
                   (&this->allocator->pool,(Context *)&stack0xffffffffffffffb8,expression,args_2);
    pEVar2 = parseSuffixes(this,&expression_00->super_Expression);
  }
  else {
    pPVar1 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x40);
    AST::TypeMetaFunction::TypeMetaFunction
              ((TypeMetaFunction *)&pPVar1->item,
               &(args_2->super_Expression).super_Statement.super_ASTObject.context,expression,op);
    pPVar1->destructor =
         PoolAllocator::
         allocate<soul::AST::TypeMetaFunction,_soul::AST::Context_&,_soul::AST::Expression_&,_soul::AST::TypeMetaFunction::Op_&>
         ::anon_class_1_0_00000001::__invoke;
    pEVar2 = parseVectorOrArrayTypeSuffixes(this,(Expression *)&pPVar1->item,metaFunctionArgument);
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)name.name);
  return pEVar2;
}

Assistant:

AST::Expression& parseDotOperator (AST::Expression& expression)
    {
        auto context = getContext();
        expect (Operator::dot);
        auto& propertyOrMethodName = parseUnqualifiedName();

        auto metaTypeOp = getOpForTypeMetaFunctionName (propertyOrMethodName);

        if (metaTypeOp != AST::TypeMetaFunction::Op::none)
            return parseVectorOrArrayTypeSuffixes (allocate<AST::TypeMetaFunction> (propertyOrMethodName.context, expression, metaTypeOp),
                                                   ParseTypeContext::metaFunctionArgument);

        return parseSuffixes (allocate<AST::DotOperator> (context, expression, propertyOrMethodName));
    }